

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O2

void dump_regressor(vw *all,io_buf *buf,bool as_text)

{
  string unused;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  save_load_header(all,buf,false,as_text,&local_38,all->options);
  if (all->l != (learner<char,_char> *)0x0) {
    LEARNER::learner<char,_char>::save_load(all->l,buf,false,as_text);
  }
  (*buf->_vptr_io_buf[7])(buf);
  (*buf->_vptr_io_buf[8])(buf);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void dump_regressor(vw& all, io_buf& buf, bool as_text)
{
  std::string unused;
  save_load_header(all, buf, false, as_text, unused, *all.options);
  if (all.l != nullptr)
    all.l->save_load(buf, false, as_text);

  buf.flush();  // close_file() should do this for me ...
  buf.close_file();
}